

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

SDL_Surface * GPU_CopySurfaceFromTarget(GPU_Target *target)

{
  GPU_Target *pGVar1;
  SDL_Surface *pSVar2;
  
  if (_gpu_current_renderer != (GPU_Renderer *)0x0) {
    pGVar1 = _gpu_current_renderer->current_context_target;
    if (target != (GPU_Target *)0x0 && pGVar1 == (GPU_Target *)0x0) {
      if (target->context == (GPU_Context *)0x0) {
        return (SDL_Surface *)0x0;
      }
      (*_gpu_current_renderer->impl->MakeCurrent)
                (_gpu_current_renderer,target,target->context->windowID);
      pGVar1 = _gpu_current_renderer->current_context_target;
    }
    if (pGVar1 != (GPU_Target *)0x0) {
      pSVar2 = (*_gpu_current_renderer->impl->CopySurfaceFromTarget)(_gpu_current_renderer,target);
      return pSVar2;
    }
  }
  return (SDL_Surface *)0x0;
}

Assistant:

SDL_Surface* GPU_CopySurfaceFromTarget(GPU_Target* target)
{
    if(_gpu_current_renderer == NULL)
        return NULL;
    MAKE_CURRENT_IF_NONE(target);
    if(_gpu_current_renderer->current_context_target == NULL)
        return NULL;

    return _gpu_current_renderer->impl->CopySurfaceFromTarget(_gpu_current_renderer, target);
}